

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-as.c
# Opt level: O3

matches * atomreg_a(iasctx *ctx,void *v,int spos)

{
  easm_expr *expr;
  int iVar1;
  matches *__ptr;
  match *res;
  
  if ((ctx->atomsnum != spos) && (ctx->atoms[spos]->type == LITEM_EXPR)) {
    expr = ctx->atoms[spos]->expr;
    __ptr = (matches *)calloc(0x10,1);
    __ptr->mmax = 0x10;
    res = (match *)malloc(0xb80);
    __ptr->m = res;
    __ptr->mnum = 1;
    *(undefined8 *)res = 0;
    res->a[0] = 0;
    res->a[1] = 0;
    res->m[0] = 0;
    res->m[1] = 0;
    res->lpos = spos + 1;
    memset(&res->field_0x2c,0,0x8c);
    iVar1 = matchreg(res,(reg *)v,expr,ctx);
    if (iVar1 != 0) {
      return __ptr;
    }
    free(res);
    free(__ptr);
  }
  return (matches *)0x0;
}

Assistant:

struct matches *atomreg_a APROTO {
	const struct reg *reg = v;
	if (spos == ctx->atomsnum || ctx->atoms[spos]->type != LITEM_EXPR)
		return 0;
	struct easm_expr *e = ctx->atoms[spos]->expr;
	struct matches *res = alwaysmatches(spos+1);
	if (matchreg(res->m, reg, e, ctx))
		return res;
	else {
		free(res->m);
		free(res);
		return 0;
	}
}